

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__load_flip(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int local_58;
  int local_50;
  int iStack_4c;
  stbi_uc temp;
  int z;
  int col;
  int row;
  int depth;
  int h;
  int w;
  uchar *result;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  puVar4 = stbi__load_main(s,x,y,comp,req_comp);
  if ((stbi__vertically_flip_on_load != 0) && (puVar4 != (uchar *)0x0)) {
    iVar2 = *x;
    iVar3 = *y;
    local_58 = req_comp;
    if (req_comp == 0) {
      local_58 = *comp;
    }
    for (z = 0; z < iVar3 >> 1; z = z + 1) {
      for (iStack_4c = 0; iStack_4c < iVar2; iStack_4c = iStack_4c + 1) {
        for (local_50 = 0; local_50 < local_58; local_50 = local_50 + 1) {
          uVar1 = puVar4[(z * iVar2 + iStack_4c) * local_58 + local_50];
          puVar4[(z * iVar2 + iStack_4c) * local_58 + local_50] =
               puVar4[(((iVar3 - z) + -1) * iVar2 + iStack_4c) * local_58 + local_50];
          puVar4[(((iVar3 - z) + -1) * iVar2 + iStack_4c) * local_58 + local_50] = uVar1;
        }
      }
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__load_flip(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result = stbi__load_main(s, x, y, comp, req_comp);

   if (stbi__vertically_flip_on_load && result != NULL) {
      int w = *x, h = *y;
      int depth = req_comp ? req_comp : *comp;
      int row,col,z;
      stbi_uc temp;

      // @OPTIMIZE: use a bigger temp buffer and memcpy multiple pixels at once
      for (row = 0; row < (h>>1); row++) {
         for (col = 0; col < w; col++) {
            for (z = 0; z < depth; z++) {
               temp = result[(row * w + col) * depth + z];
               result[(row * w + col) * depth + z] = result[((h - row - 1) * w + col) * depth + z];
               result[((h - row - 1) * w + col) * depth + z] = temp;
            }
         }
      }
   }

   return result;
}